

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

void __thiscall tcmalloc::PageHeap::Delete(PageHeap *this,Span *span)

{
  Length n;
  bool bVar1;
  SpinLockHolder local_28;
  SpinLockHolder h;
  
  local_28.lock_ = &this->lock_;
  LOCK();
  bVar1 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar1) {
    SpinLock::SlowLock(local_28.lock_);
  }
  n = span->length;
  *(uint *)&span->field_0x28 = *(uint *)&span->field_0x28 & 0xf800ffff | 0x1000000;
  MergeIntoFreeList(this,span);
  IncrementalScavenge(this,n);
  SpinLockHolder::~SpinLockHolder(&local_28);
  return;
}

Assistant:

void PageHeap::Delete(Span* span) {
  SpinLockHolder h(&lock_);
  DeleteLocked(span);
}